

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
SModeGameCommand::trigger
          (SModeGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  PlayerInfo *target;
  char *local_38;
  PlayerInfo *player_local;
  Server *source_local;
  SModeGameCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (SModeGameCommand *)parameters._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    bVar4 = sv("Error: Too few parameters. Syntax: smode <player-name>",0x36);
    target = (PlayerInfo *)bVar4._M_len;
    local_38 = bVar4._M_str;
    RenX::Server::sendMessage(source,player,target,local_38);
  }
  else {
    lVar2 = RenX::Server::getPlayerByPartName(source,this_local,parameters_local._M_len);
    if (lVar2 == 0) {
      bVar4 = sv("Error: Player not found.",0x18);
      local_68 = bVar4._M_len;
      local_60 = bVar4._M_str;
      RenX::Server::sendMessage(source,player,local_68,local_60);
    }
    else {
      uVar3 = RenX::Server::smodePlayer((PlayerInfo *)source);
      if ((uVar3 & 1) == 0) {
        bVar4 = sv("Error: Could not set player\'s mode.",0x23);
        local_78 = bVar4._M_len;
        local_70 = bVar4._M_str;
        RenX::Server::sendMessage(source,player,local_78,local_70);
      }
      else {
        bVar4 = sv("Player\'s mode has been reset.",0x1d);
        local_88 = bVar4._M_len;
        local_80 = bVar4._M_str;
        RenX::Server::sendMessage(source,player,local_88,local_80);
      }
    }
  }
  return;
}

Assistant:

void SModeGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendMessage(*player, "Error: Too few parameters. Syntax: smode <player-name>"sv);
		return;
	}

	RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
	if (target == nullptr) {
		source->sendMessage(*player, "Error: Player not found."sv);
		return;
	}

	if (!source->smodePlayer(*target)) {
		source->sendMessage(*player, "Error: Could not set player's mode."sv);
		return;
	}

	source->sendMessage(*player, "Player's mode has been reset."sv);
}